

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_ns_t>
               (timestamp_t input,timestamp_ns_t *result,bool strict)

{
  ConversionException *this;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(input.value,1000000,(int64_t *)result);
  if (bVar1) {
    return true;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not convert TIMESTAMP to TIMESTAMP_NS",&local_39);
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TryCast::Operation(timestamp_t input, timestamp_ns_t &result, bool strict) {
	D_ASSERT(Timestamp::IsFinite(input));
	if (!TryMultiplyOperator::Operation(input.value, Interval::NANOS_PER_MSEC, result.value)) {
		throw ConversionException("Could not convert TIMESTAMP to TIMESTAMP_NS");
	}
	return true;
}